

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TemporaryObject.cpp
# Opt level: O0

bool __thiscall
chatra::TemporaryObject::findConstructorCall
          (TemporaryObject *this,Reference sourceRef,Class *cl,StringId subName)

{
  StringId subName_00;
  MethodTable *this_00;
  Method *method;
  vector<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_> local_58;
  Method *local_40;
  Method *constructor;
  MethodTable *table;
  Class *pCStack_28;
  StringId subName_local;
  Class *cl_local;
  TemporaryObject *this_local;
  Reference sourceRef_local;
  
  table._4_4_ = subName;
  pCStack_28 = cl;
  cl_local = (Class *)this;
  this_local = (TemporaryObject *)sourceRef.node;
  this_00 = Class::refConstructors(cl);
  subName_00 = table._4_4_;
  local_58.super__Vector_base<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.super__Vector_base<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  constructor = (Method *)this_00;
  std::vector<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_>::vector(&local_58);
  method = MethodTable::find(this_00,(Class *)0x0,Init,subName_00,&this->args,&local_58);
  std::vector<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_>::~vector(&local_58);
  if (method != (Method *)0x0) {
    local_40 = method;
    setConstructorCall(this,(Reference)this_local,pCStack_28,(MethodTable *)constructor,method);
    resolveNativeMethod(this,Init,local_40->subName);
  }
  return method != (Method *)0x0;
}

Assistant:

bool TemporaryObject::findConstructorCall(Reference sourceRef, const Class* cl, StringId subName) {
	chatra_assert(hasArgs);
	auto& table = cl->refConstructors();
	auto* constructor = table.find(nullptr, StringId::Init, subName, args, {});
	if (constructor == nullptr)
		return false;
	setConstructorCall(sourceRef, cl, &table, constructor);
	resolveNativeMethod(StringId::Init, constructor->subName);
	return true;
}